

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O1

void helicsQueryBufferFill(HelicsQueryBuffer buffer,char *string,int stringSize,HelicsError *err)

{
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if ((buffer != (HelicsQueryBuffer)0x0) &&
       ((*(long *)((long)buffer + 8) != 0 && ((*buffer)[*(long *)((long)buffer + 8) + -1] == '>'))))
    {
      if (string == (char *)0x0 || stringSize < 1) {
        *(undefined8 *)((long)buffer + 8) = 0;
        **buffer = 0;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                   (ulong)(uint)stringSize + 1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,0,
                   *(size_type *)((long)buffer + 8),string,(ulong)(uint)stringSize);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,'>');
      return;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -3;
      err->message = "The given buffer is not valid";
    }
  }
  return;
}

Assistant:

void helicsQueryBufferFill(HelicsQueryBuffer buffer, const char* string, int stringSize, HelicsError* err)
{
    static constexpr const char* invalidBuffer = "The given buffer is not valid";

    if (((err) != nullptr) && ((err)->error_code != 0)) {
        return;
    }
    if (buffer == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBuffer);
        return;
    }

    auto* bufferStr = reinterpret_cast<std::string*>(buffer);
    if (bufferStr->empty() || bufferStr->back() != '>') {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBuffer);
        return;
    }
    if (stringSize <= 0 || string == nullptr) {
        bufferStr->clear();
        bufferStr->push_back('>');
        return;
    }
    bufferStr->reserve(static_cast<std::size_t>(stringSize) + 1);
    bufferStr->assign(string, string + stringSize);
    bufferStr->push_back('>');
}